

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall
ON_RTree::AddBranch(ON_RTree *this,ON_RTreeBranch *a_branch,ON_RTreeNode *a_node,
                   ON_RTreeNode **a_newNode)

{
  bool bVar1;
  ON_RTreeNode **a_newNode_local;
  ON_RTreeNode *a_node_local;
  ON_RTreeBranch *a_branch_local;
  ON_RTree *this_local;
  
  bVar1 = 5 < a_node->m_count;
  if (bVar1) {
    SplitNode(this,a_node,a_branch,a_newNode);
  }
  else {
    memcpy(a_node->m_branch + a_node->m_count,a_branch,0x38);
    a_node->m_count = a_node->m_count + 1;
  }
  return bVar1;
}

Assistant:

bool ON_RTree::AddBranch(ON_RTreeBranch* a_branch, ON_RTreeNode* a_node, ON_RTreeNode** a_newNode)
{
  if(a_node->m_count < ON_RTree_MAX_NODE_COUNT)  // Split won't be necessary
  {
    a_node->m_branch[a_node->m_count] = *a_branch;
    ++a_node->m_count;

    return false;
  }
  else
  {
    SplitNode(a_node, a_branch, a_newNode);
    return true;
  }
}